

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O0

void mod2dense_set(mod2dense *m,int row,int col,int value)

{
  uint *puVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  mod2word *w;
  uint local_24;
  
  if ((((-1 < in_ESI) && (in_ESI < *in_RDI)) && (-1 < in_EDX)) && (in_EDX < in_RDI[1])) {
    puVar1 = (uint *)(*(long *)(*(long *)(in_RDI + 4) + (long)in_EDX * 8) + (long)(in_ESI >> 5) * 4)
    ;
    if (in_ECX == 0) {
      local_24 = *puVar1 & (1 << ((byte)in_ESI & 0x1f) ^ 0xffffffffU);
    }
    else {
      local_24 = *puVar1 | 1 << ((byte)in_ESI & 0x1f);
    }
    *puVar1 = local_24;
    return;
  }
  fprintf(_stderr,"mod2dense_set: row or column index out of bounds\n");
  exit(1);
}

Assistant:

void mod2dense_set 
( mod2dense *m, 	/* Matrix to modify element of */
  int row,		/* Row of element (starting with zero) */
  int col,		/* Column of element (starting with zero) */
  int value		/* New value of element (0 or 1) */
)
{ 
  mod2word *w;

  if (row<0 || row>=mod2dense_rows(m) || col<0 || col>=mod2dense_cols(m))
  { fprintf(stderr,"mod2dense_set: row or column index out of bounds\n");
    exit(1);
  }

  w = &m->col[col][row>>mod2_wordsize_shift];

  *w = value ? mod2_setbit1(*w,row&mod2_wordsize_mask) 
             : mod2_setbit0(*w,row&mod2_wordsize_mask);
}